

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.h
# Opt level: O2

void __thiscall Jupiter::IRC::Client::User::User(User *this)

{
  this->m_channel_count = 0;
  (this->m_nickname)._M_dataplus._M_p = (pointer)&(this->m_nickname).field_2;
  (this->m_nickname)._M_string_length = 0;
  (this->m_nickname).field_2._M_local_buf[0] = '\0';
  (this->m_username)._M_dataplus._M_p = (pointer)&(this->m_username).field_2;
  (this->m_username)._M_string_length = 0;
  (this->m_username).field_2._M_local_buf[0] = '\0';
  (this->m_hostname)._M_dataplus._M_p = (pointer)&(this->m_hostname).field_2;
  (this->m_hostname)._M_string_length = 0;
  (this->m_hostname).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

class JUPITER_API User
			{
				friend class Jupiter::IRC::Client;
				friend class Jupiter::IRC::Client::Channel;
			public:

				/**
				* @brief Fetches the user's nickname.
				*
				* @return String containing the user's nickname.
				*/
				const std::string& getNickname() const;

				/**
				* @brief Fetches the user's username.
				*
				* @return String containing the user's username.
				*/
				const std::string& getUsername() const;

				/**
				* @brief Fetches the user's hostname.
				*
				* @return String containing the user's hostname.
				*/
				const std::string& getHostname() const;

				/**
				* @brief Returns the number of channels the user shares with the local client.
				*
				* @return Number of channels.
				*/
				size_t getChannelCount() const;

				/** Private members */
			private:
				unsigned int m_channel_count = 0;
				std::string m_nickname;
				std::string m_username;
				std::string m_hostname;
			}